

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_programmer.cpp
# Opt level: O2

void __thiscall AProgLevelEnder::Tick(AProgLevelEnder *this)

{
  int iVar1;
  
  iVar1 = (this->super_AInventory).super_AActor.special1;
  if ((this->super_AInventory).super_AActor.special2 == 0) {
    (this->super_AInventory).super_AActor.special1 = iVar1 + 0xc;
    if (0xf2 < iVar1) {
      (this->super_AInventory).super_AActor.special1 = 0xff;
      (this->super_AInventory).super_AActor.special2 = 1;
      G_ExitLevel(0,false);
      return;
    }
  }
  else {
    (this->super_AInventory).super_AActor.special1 = iVar1 + -3;
    if (iVar1 < 4) {
      (*(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject[4])();
      return;
    }
  }
  return;
}

Assistant:

void AProgLevelEnder::Tick ()
{
	if (special2 == 0)
	{ // fade out over .66 second
		special1 += 255 / (TICRATE*2/3);
		if (++special1 >= 255)
		{
			special1 = 255;
			special2 = 1;
			G_ExitLevel (0, false);
		}
	}
	else
	{ // fade in over two seconds
		special1 -= 255 / (TICRATE*2);
		if (special1 <= 0)
		{
			Destroy ();
		}
	}
}